

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_light.cpp
# Opt level: O2

Vector3D * __thiscall
CGL::SceneObjects::EnvironmentLight::sample_dir
          (Vector3D *__return_storage_ptr__,EnvironmentLight *this,Ray *r)

{
  Vector2D xy;
  Vector2D theta_phi;
  Vector2D VStack_68;
  EnvironmentLight local_58;
  
  local_58.sampler_uniform2d = (UniformGridSampler2D)(r->d).field_0.field_0.x;
  local_58.sampler_uniform_sphere = (UniformSphereSampler3D)(r->d).field_0.field_0.y;
  local_58.pdf_envmap = (double *)(r->d).field_0.field_0.z;
  dir_to_theta_phi(&local_58,(Vector3D *)this);
  theta_phi_to_xy(this,(Vector2D *)&local_58);
  bilerp(__return_storage_ptr__,this,&VStack_68);
  return __return_storage_ptr__;
}

Assistant:

Vector3D EnvironmentLight::sample_dir(const Ray& r) const {
    // TODO: 3-2 Part 3 Task 1
    // Use the helper functions to convert r.d into (x,y)
    // then bilerp the return value

    Vector2D theta_phi = dir_to_theta_phi(r.d);
    Vector2D xy = theta_phi_to_xy(theta_phi);

    return bilerp(xy);
  }